

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O1

void * coll_tmap_insert(coll_tmap_t *map,void *key,void *value)

{
  entry_t_conflict *entry;
  void *pvVar1;
  uint uVar2;
  coll_tmap_entry_t *pcVar3;
  long lVar4;
  entry_t_conflict *peVar5;
  entry_t_conflict *peVar6;
  coll_tmap_entry_t *pcVar7;
  
  pcVar7 = map->root;
  if (map->root == (coll_tmap_entry_t *)0x0) {
    pcVar7 = (coll_tmap_entry_t *)malloc(0x30);
    pcVar7->key = key;
    pcVar7->val = value;
    pcVar7->left = (coll_tmap_entry_t *)0x0;
    pcVar7->right = (coll_tmap_entry_t *)0x0;
    *(undefined8 *)((long)&pcVar7->right + 1) = 0;
    *(undefined8 *)((long)&pcVar7->parent + 1) = 0;
    map->root = pcVar7;
  }
  else {
    do {
      pcVar3 = pcVar7;
      uVar2 = (*map->cmp)(key,pcVar3->key);
      if ((int)uVar2 < 0) {
        lVar4 = 0x10;
      }
      else {
        lVar4 = 0x18;
        if (uVar2 == 0) {
          pvVar1 = pcVar3->val;
          pcVar3->val = value;
          return pvVar1;
        }
      }
      pcVar7 = *(coll_tmap_entry_t **)((long)&pcVar3->key + lVar4);
    } while (pcVar7 != (coll_tmap_entry_t *)0x0);
    peVar5 = (entry_t_conflict *)malloc(0x30);
    peVar5->key = key;
    peVar5->val = value;
    peVar5->color = '\0';
    peVar5->parent = pcVar3;
    peVar5->left = (coll_tmap_entry_t *)0x0;
    peVar5->right = (coll_tmap_entry_t *)0x0;
    (&pcVar3->left)[~uVar2 >> 0x1f] = peVar5;
    peVar5->color = '\x01';
    do {
      if ((peVar5 == map->root) || (entry = peVar5->parent, entry->color != '\x01')) break;
      if (entry == (entry_t_conflict *)0x0) {
        pcVar7 = (coll_tmap_entry_t *)0x0;
      }
      else {
        pcVar7 = entry->parent;
      }
      if (pcVar7 == (coll_tmap_entry_t *)0x0) {
        peVar6 = (entry_t_conflict *)0x0;
      }
      else {
        peVar6 = pcVar7->left;
      }
      if (entry == peVar6) {
        if (entry == (entry_t_conflict *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = entry->parent;
        }
        if (pcVar7 == (coll_tmap_entry_t *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = pcVar7->right;
        }
        if ((pcVar7 != (coll_tmap_entry_t *)0x0) && (pcVar7->color == '\x01')) goto LAB_00105baa;
        if (entry == (entry_t_conflict *)0x0) {
          peVar6 = (entry_t_conflict *)0x0;
        }
        else {
          peVar6 = entry->right;
        }
        if (peVar5 == peVar6) {
          entry_rotate_left(map,entry);
          peVar5 = entry;
        }
        if (peVar5 == (entry_t_conflict *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = peVar5->parent;
        }
        if (pcVar7 != (coll_tmap_entry_t *)0x0) {
          pcVar7->color = '\0';
        }
        if (peVar5 == (entry_t_conflict *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = peVar5->parent;
        }
        if (pcVar7 == (coll_tmap_entry_t *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = pcVar7->parent;
        }
        if (pcVar7 != (coll_tmap_entry_t *)0x0) {
          pcVar7->color = '\x01';
        }
        if (peVar5 == (entry_t_conflict *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = peVar5->parent;
        }
        if (pcVar7 == (coll_tmap_entry_t *)0x0) {
          pcVar7 = (entry_t_conflict *)0x0;
        }
        else {
          pcVar7 = pcVar7->parent;
        }
        entry_rotate_right(map,pcVar7);
      }
      else {
        if (entry == (entry_t_conflict *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = entry->parent;
        }
        if (pcVar7 == (coll_tmap_entry_t *)0x0) {
          pcVar7 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar7 = pcVar7->left;
        }
        if ((pcVar7 == (coll_tmap_entry_t *)0x0) || (pcVar7->color != '\x01')) {
          if (entry == (entry_t_conflict *)0x0) {
            peVar6 = (entry_t_conflict *)0x0;
          }
          else {
            peVar6 = entry->left;
          }
          if (peVar5 == peVar6) {
            entry_rotate_right(map,entry);
            peVar5 = entry;
          }
          if (peVar5 == (entry_t_conflict *)0x0) {
            pcVar7 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar7 = peVar5->parent;
          }
          if (pcVar7 != (coll_tmap_entry_t *)0x0) {
            pcVar7->color = '\0';
          }
          if (peVar5 == (entry_t_conflict *)0x0) {
            pcVar7 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar7 = peVar5->parent;
          }
          if (pcVar7 == (coll_tmap_entry_t *)0x0) {
            pcVar7 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar7 = pcVar7->parent;
          }
          if (pcVar7 != (coll_tmap_entry_t *)0x0) {
            pcVar7->color = '\x01';
          }
          if (peVar5 == (entry_t_conflict *)0x0) {
            pcVar7 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar7 = peVar5->parent;
          }
          if (pcVar7 == (coll_tmap_entry_t *)0x0) {
            pcVar7 = (entry_t_conflict *)0x0;
          }
          else {
            pcVar7 = pcVar7->parent;
          }
          entry_rotate_left(map,pcVar7);
        }
        else {
LAB_00105baa:
          if (entry == (entry_t_conflict *)0x0) {
            pcVar7->color = '\0';
            pcVar7 = (coll_tmap_entry_t *)0x0;
          }
          else {
            entry->color = '\0';
            pcVar7->color = '\0';
            pcVar7 = entry->parent;
          }
          if (pcVar7 != (coll_tmap_entry_t *)0x0) {
            pcVar7->color = '\x01';
          }
          if (entry == (entry_t_conflict *)0x0) {
            peVar5 = (entry_t_conflict *)0x0;
          }
          else {
            peVar5 = entry->parent;
          }
        }
      }
    } while (peVar5 != (entry_t_conflict *)0x0);
    if (map->root != (coll_tmap_entry_t *)0x0) {
      map->root->color = '\0';
    }
  }
  map->size = map->size + 1;
  return (void *)0x0;
}

Assistant:

void *coll_tmap_insert(coll_tmap_t *map, void *key, void *value) {
    entry_t *cur = map->root;
    if (!cur) {
        map->root = entry_new(key, value, NULL);
        ++(map->size);
        return NULL;
    }
    entry_t *parent = NULL;
    int result = 0;
    while (cur) {
        parent = cur;
        result = map->cmp(key, cur->key);
        if (result < 0) {
            cur = cur->left;
        } else if (result > 0) {
            cur = cur->right;
        } else {
            void *old = cur->val;
            cur->val = value;
            return old;
        }
    }
    entry_t *entry = entry_new(key, value, parent);
    if (result < 0) {
        parent->left = entry;
    } else {
        parent->right = entry;
    }
    coll_tmap_balance_insert(map, entry);
    ++(map->size);
    return NULL;
}